

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O3

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *v;
  pointer pvVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  fpclass_type fVar6;
  undefined8 uVar7;
  pthread_mutex_t *__mutex;
  unsigned_long uVar8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  pos;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  h;
  number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
  local_1cb;
  number_kind_floating_pointsinh_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>
  local_1ca;
  int_<2> local_1c9;
  pthread_mutex_t *local_1c8;
  ulong local_1c0;
  unsigned_long local_1b8;
  cpp_dec_float<100U,_int,_void> *local_1b0;
  undefined1 local_1a8 [16];
  cpp_dec_float<100U,_int,_void> *local_198;
  uint auStack_190 [2];
  cpp_dec_float<100U,_int,_void> *local_188;
  uint auStack_180 [2];
  uint local_178 [2];
  uint auStack_170 [2];
  int local_168;
  bool local_164;
  fpclass_type local_160;
  int32_t local_15c;
  expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_158;
  uint local_148 [10];
  undefined5 uStack_120;
  undefined3 uStack_11b;
  int iStack_118;
  byte bStack_114;
  undefined8 local_110;
  long local_100;
  cpp_dec_float<100U,_int,_void> local_f8;
  expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointtanh_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointsinh_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void>,_void,_void>
  local_a0;
  undefined1 local_80 [16];
  uint local_70 [2];
  uint auStack_68 [2];
  uint local_60 [2];
  uint auStack_58 [2];
  uint local_50 [4];
  int local_40;
  bool local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  __mutex = (pthread_mutex_t *)&this->m_mutex;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    uVar7 = std::__throw_system_error(iVar4);
    __cxa_guard_abort(&constants::detail::
                       constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                       ::get_from_string()::result);
    pthread_mutex_unlock(local_1c8);
    _Unwind_Resume(uVar7);
  }
  if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
      this->m_max_refinements) {
    LOCK();
    (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
         (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    uVar5 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
    local_1c8 = __mutex;
    multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)local_1a8,1,(type *)0x0);
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems._56_5_ = 0;
    local_f8.data._M_elems[0xf]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    local_1c0 = (ulong)uVar5;
    multiprecision::detail::
    number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
    ::operator()(&local_1cb,&local_f8,(cpp_dec_float<100U,_int,_void> *)local_1a8,-uVar5);
    v = &this->m_t_max;
    local_1a8._0_8_ = &local_158;
    auStack_190[0] = 2;
    local_1a8._8_8_ = v;
    local_198 = &local_f8;
    local_188 = &local_f8;
    iVar4 = multiprecision::
            itrunc<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void>,void,void,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void>,_void,_void>
                        *)local_1a8,
                       (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                        *)&local_158);
    uVar3 = local_1c0;
    local_100 = local_1c0 * 3;
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::reserve((this->m_abscissas).
              super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_1c0,(long)iVar4);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::reserve((this->m_weights).
              super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar3,(long)iVar4);
    auStack_170[1]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
    auStack_170._0_5_ = local_f8.data._M_elems._56_5_;
    local_178[0] = local_f8.data._M_elems[0xc];
    local_178[1] = local_f8.data._M_elems[0xd];
    local_188 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._32_8_;
    auStack_180[0] = local_f8.data._M_elems[10];
    auStack_180[1] = local_f8.data._M_elems[0xb];
    local_198 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._16_8_;
    auStack_190[0] = local_f8.data._M_elems[6];
    auStack_190[1] = local_f8.data._M_elems[7];
    local_1a8._0_4_ = local_f8.data._M_elems[0];
    local_1a8._4_4_ = local_f8.data._M_elems[1];
    local_1a8._8_4_ = local_f8.data._M_elems[2];
    local_1a8._12_4_ = local_f8.data._M_elems[3];
    local_168 = local_f8.exp;
    local_164 = local_f8.neg;
    local_160 = local_f8.fpclass;
    local_15c = local_f8.prec_elem;
    uVar8 = 0;
    if ((local_f8.fpclass != cpp_dec_float_NaN) &&
       ((this->m_t_max).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_1b0 = &(this->m_t_crossover).m_backend;
      local_1b8 = 0;
      while (iVar4 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_1a8,&v->m_backend),
            iVar4 < 0) {
        fVar6 = (this->m_t_crossover).m_backend.fpclass;
        if (fVar6 != cpp_dec_float_NaN && local_160 != cpp_dec_float_NaN) {
          uVar5 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_1a8,local_1b0);
          local_1b8 = local_1b8 + (uVar5 >> 0x1f);
          fVar6 = (this->m_t_crossover).m_backend.fpclass;
        }
        pvVar1 = (this->m_abscissas).
                 super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((local_160 == cpp_dec_float_NaN) || (fVar6 == cpp_dec_float_NaN)) ||
           (iVar4 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_1a8,local_1b0), -1 < iVar4))
        {
          abscissa_complement_at_t
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)local_80,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)local_1a8);
          local_158._0_8_ = local_80._0_8_;
          uVar7 = local_158._0_8_;
          local_158.arg2 = (type)local_80._8_8_;
          local_148[8] = local_50[0];
          local_148[9] = local_50[1];
          uStack_120 = (undefined5)local_50._8_8_;
          uStack_11b = SUB83(local_50._8_8_,5);
          local_148[4] = local_60[0];
          local_148[5] = local_60[1];
          local_148[6] = auStack_58[0];
          local_148[7] = auStack_58[1];
          local_148[0] = local_70[0];
          local_148[1] = local_70[1];
          local_148[2] = auStack_68[0];
          local_148[3] = auStack_68[1];
          iStack_118 = local_40;
          bStack_114 = local_3c;
          local_110._0_4_ = local_38;
          local_110._4_4_ = iStack_34;
          local_158.arg1 = (type_conflict2)local_80._0_8_;
          bVar2 = local_158.arg1 != 0;
          local_158._0_8_ = uVar7;
          if ((fpclass_type)_local_38 != cpp_dec_float_finite || bVar2) {
            bStack_114 = local_3c ^ 1;
          }
        }
        else {
          if ((constants::detail::
               constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
               ::get_from_string()::result == '\0') &&
             (iVar4 = __cxa_guard_acquire(&constants::detail::
                                           constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                                           ::get_from_string()::result), iVar4 != 0)) {
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._72_8_ = 0x1000000000;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._0_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._8_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._16_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._24_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._32_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._40_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._48_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._56_5_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._61_3_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._64_5_ = 0;
            multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
                      ((cpp_dec_float<100U,_int,_void> *)
                       constants::detail::
                       constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                       ::get_from_string()::result,
                       "1.57079632679489661923132169163975144209858469968755291048747229615390820314310449931401741267105853399107404326e+00"
                      );
            __cxa_guard_release(&constants::detail::
                                 constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                                 ::get_from_string()::result);
          }
          local_a0.arg1 = (type)&local_1c9;
          local_a0.arg2.arg1 =
               (type)constants::detail::
                     constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                     ::get_from_string()::result;
          local_a0.arg2.arg2.arg1 = &local_1ca;
          local_110._0_4_ = cpp_dec_float_finite;
          local_110._4_4_ = 0x10;
          local_158.arg1 = 0;
          local_158._4_4_ = 0;
          local_158.arg2 = (type)0x0;
          local_148[0] = 0;
          local_148[1] = 0;
          local_148[2] = 0;
          local_148[3] = 0;
          local_148[4] = 0;
          local_148[5] = 0;
          local_148[6] = 0;
          local_148[7] = 0;
          local_148[8] = 0;
          local_148[9] = 0;
          uStack_120 = 0;
          uStack_11b = 0;
          iStack_118 = 0;
          bStack_114 = 0;
          local_a0.arg2.arg2.arg2 = (type)local_1a8;
          multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
          ::
          do_assign_function<boost::multiprecision::detail::expression<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointtanh_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::detail::expression<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointsinh_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void>,void,void>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                      *)&local_158,&local_a0,(int_<2> *)local_a0.arg1);
        }
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
        ::
        emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                    *)(pvVar1 + uVar3),
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_158);
        local_158.arg1 = 2;
        local_158.arg2 = (type)&local_f8;
        multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                      *)local_1a8,&local_158);
        if ((local_160 == cpp_dec_float_NaN) ||
           ((this->m_t_max).m_backend.fpclass == cpp_dec_float_NaN)) break;
      }
      uVar8 = local_1b8;
    }
    __mutex = local_1c8;
    (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[local_1c0] = uVar8;
    auStack_170[1]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
    auStack_170._0_5_ = local_f8.data._M_elems._56_5_;
    local_178[0] = local_f8.data._M_elems[0xc];
    local_178[1] = local_f8.data._M_elems[0xd];
    local_188 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._32_8_;
    auStack_180[0] = local_f8.data._M_elems[10];
    auStack_180[1] = local_f8.data._M_elems[0xb];
    local_198 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._16_8_;
    auStack_190[0] = local_f8.data._M_elems[6];
    auStack_190[1] = local_f8.data._M_elems[7];
    local_1a8._0_4_ = local_f8.data._M_elems[0];
    local_1a8._4_4_ = local_f8.data._M_elems[1];
    local_1a8._8_4_ = local_f8.data._M_elems[2];
    local_1a8._12_4_ = local_f8.data._M_elems[3];
    local_168 = local_f8.exp;
    local_164 = local_f8.neg;
    local_160 = local_f8.fpclass;
    local_15c = local_f8.prec_elem;
    if ((local_f8.fpclass != cpp_dec_float_NaN) &&
       ((this->m_t_max).m_backend.fpclass != cpp_dec_float_NaN)) {
      while (iVar4 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_1a8,&v->m_backend),
            iVar4 < 0) {
        pvVar1 = (this->m_weights).
                 super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        weight_at_t((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)&local_158,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)local_1a8);
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
        ::
        emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                    *)((long)&(pvVar1->
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                              )._M_impl.super__Vector_impl_data + local_100 * 8),
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_158);
        local_158.arg1 = 2;
        local_158.arg2 = (type)&local_f8;
        multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                      *)local_1a8,&local_158);
        if ((local_160 == cpp_dec_float_NaN) ||
           ((this->m_t_max).m_backend.fpclass == cpp_dec_float_NaN)) break;
      }
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }